

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_addic_(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 arg2;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  arg2 = tcg_const_i64_ppc64(tcg_ctx,(long)(short)ctx->opcode);
  gen_op_arith_add(ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),
                   *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),arg2,cpu_ca,
                   cpu_ca32,false,true,false,true);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_addic_(DisasContext *ctx)
{
    gen_op_addic(ctx, 1);
}